

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void insertCell(MemPage *pPage,int i,u8 *pCell,int sz,u8 *pTemp,Pgno iChild,int *pRC)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  u8 *puVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int local_54;
  ulong local_50;
  u8 *local_48;
  int local_3c;
  int *local_38;
  
  if ((pPage->nOverflow != '\0') || (local_3c = sz + 2, (int)(uint)pPage->nFree < local_3c)) {
    if (pTemp != (u8 *)0x0) {
      memcpy(pTemp,pCell,(long)sz);
      pCell = pTemp;
    }
    if (iChild != 0) {
      *(Pgno *)pCell =
           iChild >> 0x18 | (iChild & 0xff0000) >> 8 | (iChild & 0xff00) << 8 | iChild << 0x18;
    }
    bVar2 = pPage->nOverflow;
    pPage->nOverflow = bVar2 + 1;
    pPage->apOvfl[bVar2] = pCell;
    pPage->aiOvfl[bVar2] = (u16)i;
    return;
  }
  iVar4 = sqlite3PagerWrite(pPage->pDbPage);
  if (iVar4 != 0) {
    *pRC = iVar4;
    return;
  }
  local_38 = pRC;
  local_48 = pPage->aData;
  uVar9 = (ulong)pPage->hdrOffset;
  local_54 = 0;
  uVar10 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
  uVar3 = *(ushort *)(local_48 + uVar9 + 5) << 8 | *(ushort *)(local_48 + uVar9 + 5) >> 8;
  uVar7 = (uint)uVar3;
  if ((uVar3 < uVar10) && ((uVar3 != 0 || (uVar7 = 0x10000, pPage->pBt->usableSize != 0x10000)))) {
    iVar4 = sqlite3CorruptError(0xeec5);
LAB_0013a0cf:
    *local_38 = iVar4;
  }
  else {
    if (((local_48[uVar9 + 2] == '\0') && (local_48[uVar9 + 1] == '\0')) || (uVar7 < uVar10 + 2)) {
LAB_0013a0a1:
      puVar6 = local_48;
      if ((int)uVar7 < (int)(uVar10 + 2 + sz)) {
        iVar5 = ((uint)pPage->nFree - sz) + -2;
        iVar4 = 4;
        if (iVar5 < 4) {
          iVar4 = iVar5;
        }
        local_50 = uVar9;
        iVar4 = defragmentPage(pPage,iVar4);
        if (iVar4 != 0) goto LAB_0013a0cf;
        uVar7 = (((uint)puVar6[local_50 + 5] * 0x100 + (uint)puVar6[local_50 + 6]) - 1 & 0xffff) + 1
        ;
        uVar9 = local_50;
      }
      iVar4 = uVar7 - sz;
      *(ushort *)(puVar6 + uVar9 + 5) = (ushort)iVar4 << 8 | (ushort)iVar4 >> 8;
    }
    else {
      local_50 = uVar9;
      puVar6 = pageFindSlot(pPage,sz,&local_54);
      if (puVar6 == (u8 *)0x0) {
        uVar9 = local_50;
        iVar4 = local_54;
        if (local_54 != 0) goto LAB_0013a0cf;
        goto LAB_0013a0a1;
      }
      iVar4 = (int)puVar6 - (int)local_48;
      puVar6 = local_48;
    }
    pPage->nFree = pPage->nFree - (short)local_3c;
    memcpy(puVar6 + iVar4,pCell,(long)sz);
    if (iChild != 0) {
      *(Pgno *)(puVar6 + iVar4) =
           iChild >> 0x18 | (iChild & 0xff0000) >> 8 | (iChild & 0xff00) << 8 | iChild << 0x18;
    }
    lVar8 = (long)i;
    puVar1 = (ushort *)(pPage->aCellIdx + lVar8 * 2);
    memmove(puVar1 + 1,pPage->aCellIdx + lVar8 * 2,((ulong)pPage->nCell - lVar8) * 2);
    *puVar1 = (ushort)iVar4 << 8 | (ushort)iVar4 >> 8;
    pPage->nCell = pPage->nCell + 1;
    puVar6 = local_48 + (ulong)pPage->hdrOffset + 4;
    *puVar6 = *puVar6 + '\x01';
    if (*puVar6 == '\0') {
      local_48[(ulong)pPage->hdrOffset + 3] = local_48[(ulong)pPage->hdrOffset + 3] + '\x01';
    }
    if (pPage->pBt->autoVacuum != '\0') {
      ptrmapPutOvflPtr(pPage,pCell,local_38);
      return;
    }
  }
  return;
}

Assistant:

static void insertCell(
  MemPage *pPage,   /* Page into which we are copying */
  int i,            /* New cell becomes the i-th cell of the page */
  u8 *pCell,        /* Content of the new cell */
  int sz,           /* Bytes of content in pCell */
  u8 *pTemp,        /* Temp storage space for pCell, if needed */
  Pgno iChild,      /* If non-zero, replace first 4 bytes with this value */
  int *pRC          /* Read and write return code from here */
){
  int idx = 0;      /* Where to write new cell content in data[] */
  int j;            /* Loop counter */
  u8 *data;         /* The content of the whole page */
  u8 *pIns;         /* The point in pPage->aCellIdx[] where no cell inserted */

  assert( *pRC==SQLITE_OK );
  assert( i>=0 && i<=pPage->nCell+pPage->nOverflow );
  assert( MX_CELL(pPage->pBt)<=10921 );
  assert( pPage->nCell<=MX_CELL(pPage->pBt) || CORRUPT_DB );
  assert( pPage->nOverflow<=ArraySize(pPage->apOvfl) );
  assert( ArraySize(pPage->apOvfl)==ArraySize(pPage->aiOvfl) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  /* The cell should normally be sized correctly.  However, when moving a
  ** malformed cell from a leaf page to an interior page, if the cell size
  ** wanted to be less than 4 but got rounded up to 4 on the leaf, then size
  ** might be less than 8 (leaf-size + pointer) on the interior node.  Hence
  ** the term after the || in the following assert(). */
  assert( sz==pPage->xCellSize(pPage, pCell) || (sz==8 && iChild>0) );
  if( pPage->nOverflow || sz+2>pPage->nFree ){
    if( pTemp ){
      memcpy(pTemp, pCell, sz);
      pCell = pTemp;
    }
    if( iChild ){
      put4byte(pCell, iChild);
    }
    j = pPage->nOverflow++;
    /* Comparison against ArraySize-1 since we hold back one extra slot
    ** as a contingency.  In other words, never need more than 3 overflow
    ** slots but 4 are allocated, just to be safe. */
    assert( j < ArraySize(pPage->apOvfl)-1 );
    pPage->apOvfl[j] = pCell;
    pPage->aiOvfl[j] = (u16)i;

    /* When multiple overflows occur, they are always sequential and in
    ** sorted order.  This invariants arise because multiple overflows can
    ** only occur when inserting divider cells into the parent page during
    ** balancing, and the dividers are adjacent and sorted.
    */
    assert( j==0 || pPage->aiOvfl[j-1]<(u16)i ); /* Overflows in sorted order */
    assert( j==0 || i==pPage->aiOvfl[j-1]+1 );   /* Overflows are sequential */
  }else{
    int rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc!=SQLITE_OK ){
      *pRC = rc;
      return;
    }
    assert( sqlite3PagerIswriteable(pPage->pDbPage) );
    data = pPage->aData;
    assert( &data[pPage->cellOffset]==pPage->aCellIdx );
    rc = allocateSpace(pPage, sz, &idx);
    if( rc ){ *pRC = rc; return; }
    /* The allocateSpace() routine guarantees the following properties
    ** if it returns successfully */
    assert( idx >= 0 );
    assert( idx >= pPage->cellOffset+2*pPage->nCell+2 || CORRUPT_DB );
    assert( idx+sz <= (int)pPage->pBt->usableSize );
    pPage->nFree -= (u16)(2 + sz);
    memcpy(&data[idx], pCell, sz);
    if( iChild ){
      put4byte(&data[idx], iChild);
    }
    pIns = pPage->aCellIdx + i*2;
    memmove(pIns+2, pIns, 2*(pPage->nCell - i));
    put2byte(pIns, idx);
    pPage->nCell++;
    /* increment the cell count */
    if( (++data[pPage->hdrOffset+4])==0 ) data[pPage->hdrOffset+3]++;
    assert( get2byte(&data[pPage->hdrOffset+3])==pPage->nCell );
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pPage->pBt->autoVacuum ){
      /* The cell may contain a pointer to an overflow page. If so, write
      ** the entry for the overflow page into the pointer map.
      */
      ptrmapPutOvflPtr(pPage, pCell, pRC);
    }
#endif
  }
}